

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

char * my_strdup(char *source)

{
  size_t sVar1;
  char *pcVar2;
  
  if (source != (char *)0x0) {
    sVar1 = strlen(source);
    pcVar2 = (char *)malloc(sVar1 + 1);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strcpy(pcVar2,source);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static char * my_strdup(const char * source) {
	if (source == NULL) {
		return NULL;
	}

	char * result = malloc(strlen(source) + 1);

	if (result) {
		strcpy(result, source);
	}

	return result;
}